

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O0

void __thiscall
SphereTriangleDetector::getClosestPoints
          (SphereTriangleDetector *this,ClosestPointInput *input,Result *output,
          btIDebugDraw *debugDraw,bool swapResults)

{
  byte bVar1;
  bool bVar2;
  btVector3 *in_RCX;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  SphereTriangleDetector *in_RDI;
  byte in_R8B;
  btVector3 pointOnA;
  btVector3 normalOnA;
  btVector3 normalOnB;
  btTransform sphereInTr;
  btScalar depth;
  btScalar timeOfImpact;
  btVector3 normal;
  btVector3 point;
  btTransform *transformB;
  btTransform *transformA;
  btVector3 *in_stack_fffffffffffffed8;
  btTransform *in_stack_fffffffffffffee0;
  btTransform *pbVar3;
  btMatrix3x3 *in_stack_fffffffffffffef0;
  btScalar local_100 [4];
  btScalar local_f0 [4];
  btScalar local_e0 [4];
  btScalar local_d0 [4];
  undefined1 in_stack_ffffffffffffff40 [16];
  undefined1 local_b0 [80];
  undefined4 local_60;
  undefined4 local_5c;
  btVector3 local_58;
  btVector3 local_48;
  undefined7 in_stack_ffffffffffffffd8;
  btVector3 *sphereCenter;
  SphereTriangleDetector *this_00;
  
  bVar1 = in_R8B & 1;
  pbVar3 = (btTransform *)(in_RSI + 4);
  sphereCenter = in_RSI;
  this_00 = in_RDI;
  btVector3::btVector3(&local_48);
  btVector3::btVector3(&local_58);
  local_5c = 0x3f800000;
  local_60 = 0;
  btTransform::inverseTimes(in_stack_ffffffffffffff40._8_8_,in_stack_ffffffffffffff40._0_8_);
  btTransform::getOrigin((btTransform *)(local_b0 + 0x10));
  bVar2 = collide(this_00,sphereCenter,in_RDX,in_RCX,
                  (btScalar *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),in_RSI->m_floats,
                  (btScalar)((ulong)pbVar3 >> 0x20));
  if (bVar2) {
    if ((bVar1 & 1) == 0) {
      btTransform::getBasis(pbVar3);
      local_100 = (btScalar  [4])::operator*(in_stack_fffffffffffffef0,(btVector3 *)in_RDI);
      btTransform::operator*(in_stack_fffffffffffffee0,in_RDX);
      (**(code **)(*(long *)in_RDX->m_floats + 0x20))
                (local_60,in_RDX,local_100,&stack0xfffffffffffffef0);
    }
    else {
      btTransform::getBasis(pbVar3);
      local_b0._0_16_ = (undefined1  [16])::operator*(in_stack_fffffffffffffef0,(btVector3 *)in_RDI)
      ;
      pbVar3 = (btTransform *)local_b0;
      operator-((btVector3 *)pbVar3);
      local_e0 = (btScalar  [4])btTransform::operator*(pbVar3,in_stack_fffffffffffffed8);
      local_f0 = (btScalar  [4])::operator*(in_stack_fffffffffffffef0->m_el,(btScalar *)in_RDI);
      local_d0 = (btScalar  [4])operator+(in_stack_fffffffffffffef0->m_el,(btVector3 *)in_RDI);
      (**(code **)(*(long *)in_RDX->m_floats + 0x20))
                (local_60,in_RDX,&stack0xffffffffffffff40,local_d0);
    }
  }
  return;
}

Assistant:

void	SphereTriangleDetector::getClosestPoints(const ClosestPointInput& input,Result& output,class btIDebugDraw* debugDraw,bool swapResults)
{

	(void)debugDraw;
	const btTransform& transformA = input.m_transformA;
	const btTransform& transformB = input.m_transformB;

	btVector3 point,normal;
	btScalar timeOfImpact = btScalar(1.);
	btScalar depth = btScalar(0.);
//	output.m_distance = btScalar(BT_LARGE_FLOAT);
	//move sphere into triangle space
	btTransform	sphereInTr = transformB.inverseTimes(transformA);

	if (collide(sphereInTr.getOrigin(),point,normal,depth,timeOfImpact,m_contactBreakingThreshold))
	{
		if (swapResults)
		{
			btVector3 normalOnB = transformB.getBasis()*normal;
			btVector3 normalOnA = -normalOnB;
			btVector3 pointOnA = transformB*point+normalOnB*depth;
			output.addContactPoint(normalOnA,pointOnA,depth);
		} else
		{
			output.addContactPoint(transformB.getBasis()*normal,transformB*point,depth);
		}
	}

}